

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

uint8 * google::protobuf::internal::SerializeInternalToArray
                  (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
                  bool is_deterministic,uint8 *buffer)

{
  bool bVar1;
  ArrayOutput *output_00;
  byte in_CL;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  uint8 *in_R8;
  CodedOutputStream output_1;
  ArrayOutputStream array_stream;
  uint8 *ptr;
  FieldMetadata *field_metadata;
  int i;
  SpecialSerializer func;
  ArrayOutput *output;
  ArrayOutput array_output;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  FieldMetadata *in_stack_ffffffffffffff18;
  FieldMetadata *in_stack_ffffffffffffff28;
  ArrayOutputStream *in_stack_ffffffffffffff30;
  undefined1 local_c8 [44];
  int in_stack_ffffffffffffff64;
  ArrayOutput *in_stack_ffffffffffffff70;
  FieldMetadata *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  FieldMetadata local_78;
  void *local_58;
  uint *local_50;
  int local_44;
  code *local_40;
  uint8 **local_38;
  uint8 *local_30;
  byte local_28;
  byte local_15;
  int local_14;
  long local_10;
  void *local_8;
  
  local_28 = in_CL & 1;
  local_38 = &local_30;
  local_40 = (code *)0x0;
  local_30 = in_R8;
  local_15 = local_28;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_44 = 0; local_44 < local_14; local_44 = local_44 + 1) {
    local_50 = (uint *)(local_10 + (long)local_44 * 0x18);
    local_58 = (void *)((long)local_8 + (ulong)*local_50);
    output_00 = (ArrayOutput *)(ulong)local_50[3];
    switch(output_00) {
    case (ArrayOutput *)0x0:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d68e6);
      }
      break;
    case (ArrayOutput *)0x1:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d69f5);
      }
      break;
    case (ArrayOutput *)0x2:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6b04);
      }
      break;
    case (ArrayOutput *)0x3:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6c13);
      }
      break;
    case (ArrayOutput *)0x4:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6d22);
      }
      break;
    case (ArrayOutput *)0x5:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6e31);
      }
      break;
    case (ArrayOutput *)0x6:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6f40);
      }
      break;
    case (ArrayOutput *)0x7:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d704f);
      }
      break;
    case (ArrayOutput *)0x8:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d715e);
      }
      break;
    case (ArrayOutput *)0x9:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d726d);
      }
      break;
    case (ArrayOutput *)0xa:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d737c);
      }
      break;
    case (ArrayOutput *)0xb:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d748b);
      }
      break;
    case (ArrayOutput *)0xc:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d759a);
      }
      break;
    case (ArrayOutput *)0xd:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d76a9);
      }
      break;
    case (ArrayOutput *)0xe:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d77b8);
      }
      break;
    case (ArrayOutput *)0xf:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d78c7);
      }
      break;
    case (ArrayOutput *)0x10:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d79d6);
      }
      break;
    case (ArrayOutput *)0x11:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7ae5);
      }
      break;
    default:
      SerializeNotImplemented(in_stack_ffffffffffffff64);
      break;
    case (ArrayOutput *)0x14:
      bVar1 = IsPresent(local_8,local_50[2]);
      if (bVar1) {
        SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7bf4);
      }
      break;
    case (ArrayOutput *)0x15:
      bVar1 = IsNull<1>(local_58);
      if (!bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6920);
      }
      break;
    case (ArrayOutput *)0x16:
      bVar1 = IsNull<2>(local_58);
      if (!bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6a2f);
      }
      break;
    case (ArrayOutput *)0x17:
      bVar1 = IsNull<3>(local_58);
      if (!bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6b3e);
      }
      break;
    case (ArrayOutput *)0x18:
      bVar1 = IsNull<4>(local_58);
      if (!bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6c4d);
      }
      break;
    case (ArrayOutput *)0x19:
      bVar1 = IsNull<5>(local_58);
      if (!bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6d5c);
      }
      break;
    case (ArrayOutput *)0x1a:
      bVar1 = IsNull<6>(local_58);
      if (!bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6e6b);
      }
      break;
    case (ArrayOutput *)0x1b:
      bVar1 = IsNull<7>(local_58);
      if (!bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6f7a);
      }
      break;
    case (ArrayOutput *)0x1c:
      bVar1 = IsNull<8>(local_58);
      if (!bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7089);
      }
      break;
    case (ArrayOutput *)0x1d:
      bVar1 = IsNull<9>((void *)0x3d7170);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7198);
      }
      break;
    case (ArrayOutput *)0x1e:
      bVar1 = IsNull<10>((void *)0x3d727f);
      if (!bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d72a7);
      }
      break;
    case (ArrayOutput *)0x1f:
      bVar1 = IsNull<11>((void *)0x3d738e);
      if (!bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d73b6);
      }
      break;
    case (ArrayOutput *)0x20:
      bVar1 = IsNull<12>((void *)0x3d749d);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d74c5);
      }
      break;
    case (ArrayOutput *)0x21:
      bVar1 = IsNull<13>(local_58);
      if (!bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d75d4);
      }
      break;
    case (ArrayOutput *)0x22:
      bVar1 = IsNull<14>(local_58);
      if (!bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d76e3);
      }
      break;
    case (ArrayOutput *)0x23:
      bVar1 = IsNull<15>(local_58);
      if (!bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d77f2);
      }
      break;
    case (ArrayOutput *)0x24:
      bVar1 = IsNull<16>(local_58);
      if (!bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7901);
      }
      break;
    case (ArrayOutput *)0x25:
      bVar1 = IsNull<17>(local_58);
      if (!bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7a10);
      }
      break;
    case (ArrayOutput *)0x26:
      bVar1 = IsNull<18>(local_58);
      if (!bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7b1f);
      }
      break;
    case (ArrayOutput *)0x29:
      bVar1 = IsNull<21>((void *)0x3d7c06);
      if (!bVar1) {
        SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7c2e);
      }
      break;
    case (ArrayOutput *)0x2a:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x2b:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x2c:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x2d:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x2e:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x2f:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x30:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x31:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x32:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x33:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x34:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x35:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x36:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x37:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x38:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x39:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x3a:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x3b:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x3e:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (output_00,in_stack_ffffffffffffff18,
                 (ArrayOutput *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      break;
    case (ArrayOutput *)0x3f:
      PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x40:
      PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x41:
      PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x42:
      PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x43:
      PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x44:
      PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x45:
      PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x46:
      PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    case (ArrayOutput *)0x48:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    case (ArrayOutput *)0x49:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    case (ArrayOutput *)0x4a:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    case (ArrayOutput *)0x4b:
      PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x4c:
      PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x4d:
      PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x4e:
      PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x4f:
      PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x50:
      PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,output_00);
      break;
    case (ArrayOutput *)0x53:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    case (ArrayOutput *)0x54:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d69b2);
      }
      break;
    case (ArrayOutput *)0x55:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6ac1);
      }
      break;
    case (ArrayOutput *)0x56:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6bd0);
      }
      break;
    case (ArrayOutput *)0x57:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6cdf);
      }
      break;
    case (ArrayOutput *)0x58:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6dee);
      }
      break;
    case (ArrayOutput *)0x59:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d6efd);
      }
      break;
    case (ArrayOutput *)0x5a:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d700c);
      }
      break;
    case (ArrayOutput *)0x5b:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d711b);
      }
      break;
    case (ArrayOutput *)0x5c:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d722a);
      }
      break;
    case (ArrayOutput *)0x5d:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7339);
      }
      break;
    case (ArrayOutput *)0x5e:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7448);
      }
      break;
    case (ArrayOutput *)0x5f:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<12>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7557);
      }
      break;
    case (ArrayOutput *)0x60:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7666);
      }
      break;
    case (ArrayOutput *)0x61:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7775);
      }
      break;
    case (ArrayOutput *)0x62:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7884);
      }
      break;
    case (ArrayOutput *)0x63:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7993);
      }
      break;
    case (ArrayOutput *)0x64:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7aa2);
      }
      break;
    case (ArrayOutput *)0x65:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7bb1);
      }
      break;
    case (ArrayOutput *)0x68:
      bVar1 = IsOneofPresent(local_8,local_50[2],local_50[1]);
      if (bVar1) {
        OneOfFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  ((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (FieldMetadata *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (ArrayOutput *)0x3d7cc0);
      }
      break;
    case (ArrayOutput *)0x69:
      in_stack_ffffffffffffff18 = &local_78;
      io::ArrayOutputStream::ArrayOutputStream
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0,local_50[3]);
      io::CodedOutputStream::CodedOutputStream
                ((CodedOutputStream *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (ZeroCopyOutputStream *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      io::CodedOutputStream::SetSerializationDeterministic
                ((CodedOutputStream *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (bool)in_stack_ffffffffffffff0f);
      local_40 = *(code **)(local_50 + 4);
      (*local_40)(local_8,*local_50,local_50[1],local_50[2],local_c8);
      in_stack_ffffffffffffff14 =
           io::CodedOutputStream::ByteCount
                     ((CodedOutputStream *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_30 = local_30 + in_stack_ffffffffffffff14;
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)0x3d7d82);
      io::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)0x3d7d8f);
    }
  }
  return local_30;
}

Assistant:

uint8* SerializeInternalToArray(const uint8* base,
                                const FieldMetadata* field_metadata_table,
                                int32 num_fields, bool is_deterministic,
                                uint8* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output(&array_stream);
        output.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output);
        array_output.ptr += output.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}